

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_ldm.c
# Opt level: O3

size_t ZSTD_ldm_generateSequences
                 (ldmState_t *ldmState,rawSeqStore_t *sequences,ldmParams_t *params,void *src,
                 size_t srcSize)

{
  BYTE **ppBVar1;
  ulong *puVar2;
  ulong *puVar3;
  ulong *puVar4;
  ulong *puVar5;
  U32 *pUVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  U32 UVar9;
  U32 UVar10;
  uint uVar11;
  uint uVar12;
  ldmEntry_t *plVar13;
  U64 UVar14;
  rawSeq *prVar15;
  bool bVar16;
  ldmParams_t ldmParams;
  ldmParams_t ldmParams_00;
  ldmParams_t ldmParams_01;
  BYTE *pBVar17;
  long lVar18;
  U32 newLowLimit;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  U32 UVar22;
  ulong uVar23;
  ulong uVar24;
  ulong *puVar25;
  ulong *puVar26;
  ulong uVar27;
  uint uVar28;
  long lVar29;
  ulong *puVar30;
  U32 hBits;
  ulong *puVar31;
  ldmEntry_t *plVar32;
  BYTE *pBVar33;
  long lVar34;
  ulong *puVar35;
  ulong *puVar36;
  ulong *puVar37;
  uint uVar38;
  ulong uVar39;
  ulong uVar40;
  ulong *puVar41;
  uint uVar42;
  ulong uVar43;
  ulong *puVar44;
  ulong *puVar45;
  long lVar46;
  ulong uVar47;
  ulong uVar48;
  int iVar49;
  ulong *puVar50;
  U32 UVar51;
  size_t sVar52;
  size_t sVar53;
  size_t sVar54;
  undefined1 in_stack_fffffffffffffe48 [12];
  uint uVar55;
  ulong *local_198;
  BYTE *local_180;
  void *local_178;
  ulong local_138;
  long local_d0;
  ulong local_c8;
  ldmEntry_t *local_c0;
  
  uVar38 = 1 << ((byte)params->windowLog & 0x1f);
  lVar29 = (ulong)((srcSize & 0xfffff) != 0) + (srcSize >> 0x14);
  if (lVar29 != 0) {
    lVar46 = 0;
    uVar23 = sequences->size;
    sVar52 = 0;
    local_178 = src;
    do {
      puVar26 = (ulong *)0x0;
      if (sequences->capacity <= uVar23) {
        return 0;
      }
      puVar3 = (ulong *)((long)src + lVar46 * 0x100000);
      puVar31 = puVar3 + 0x20000;
      if (srcSize + lVar46 * -0x100000 < 0x100000) {
        puVar31 = (ulong *)((long)src + srcSize);
      }
      local_180 = (ldmState->window).base;
      uVar19 = (int)puVar31 - (int)local_180;
      if (0xe0000000 < uVar19) {
        UVar9 = params->hashLog;
        uVar19 = ((int)src - (int)local_180) - uVar38;
        local_180 = local_180 + uVar19;
        (ldmState->window).base = local_180;
        ppBVar1 = &(ldmState->window).dictBase;
        *ppBVar1 = *ppBVar1 + uVar19;
        uVar7 = (ldmState->window).dictLimit;
        uVar8 = (ldmState->window).lowLimit;
        (ldmState->window).dictLimit = uVar7 - uVar19;
        (ldmState->window).lowLimit = uVar8 - uVar19;
        plVar13 = ldmState->hashTable;
        lVar34 = 0;
        do {
          uVar28 = plVar13[lVar34].offset;
          puVar25 = (ulong *)(ulong)(uVar28 - uVar19);
          if (uVar28 < uVar19) {
            puVar25 = puVar26;
          }
          plVar13[lVar34].offset = (U32)puVar25;
          lVar34 = lVar34 + 1;
        } while (1L << ((byte)UVar9 & 0x3f) != lVar34);
        uVar19 = (int)puVar31 - (int)local_180;
      }
      uVar28 = (ldmState->window).lowLimit;
      uVar20 = uVar19 - uVar38;
      if (uVar19 < uVar38 || uVar20 == 0) {
        uVar19 = (ldmState->window).dictLimit;
      }
      else {
        if (uVar28 < uVar20) {
          (ldmState->window).lowLimit = uVar20;
          uVar28 = uVar20;
        }
        uVar19 = (ldmState->window).dictLimit;
        if (uVar19 < uVar28) {
          (ldmState->window).dictLimit = uVar28;
          uVar19 = uVar28;
        }
      }
      UVar9 = params->bucketSizeLog;
      uVar20 = params->hashEveryLog;
      UVar10 = params->hashLog;
      uVar11 = params->minMatchLength;
      uVar24 = (ulong)uVar11;
      UVar14 = ldmState->hashPower;
      if (uVar28 < uVar19) {
        pBVar33 = (ldmState->window).dictBase;
        uVar21 = uVar28;
      }
      else {
        pBVar33 = (BYTE *)0x0;
        uVar21 = uVar19;
      }
      uVar43 = (ulong)uVar19;
      sVar53 = (long)puVar31 - (long)puVar3;
      puVar25 = (ulong *)(pBVar33 + uVar21);
      if (uVar19 <= uVar28) {
        puVar25 = puVar26;
      }
      puVar4 = (ulong *)((long)puVar3 + sVar53);
      uVar39 = 8;
      if (8 < uVar11) {
        uVar39 = uVar24;
      }
      puVar45 = (ulong *)((long)puVar4 - uVar39);
      sVar54 = sVar53;
      if (puVar3 <= puVar45) {
        hBits = UVar10 - UVar9;
        puVar5 = (ulong *)(local_180 + uVar43);
        uVar42 = 0x20 - hBits;
        puVar2 = (ulong *)((long)puVar4 - 7);
        puVar44 = (ulong *)(ulong)(uVar42 - uVar20);
        if (uVar42 < uVar20) {
          puVar44 = puVar26;
        }
        puVar26 = (ulong *)0x0;
        uVar39 = 0;
        puVar50 = puVar3;
        uVar55 = uVar28;
        local_198 = puVar3;
        do {
          if (puVar50 == puVar3) {
            if (uVar11 == 0) {
              uVar39 = 0;
            }
            else {
              uVar27 = 0;
              uVar39 = 0;
              do {
                uVar39 = uVar39 * -0x30e44323485a9b9d + (ulong)*(byte *)((long)local_178 + uVar27) +
                         10;
                uVar27 = uVar27 + 1;
              } while (uVar24 != uVar27);
            }
          }
          else {
            uVar39 = (uVar39 - ((ulong)(byte)*puVar26 + 10) * UVar14) * -0x30e44323485a9b9d +
                     (ulong)*(byte *)((long)puVar26 + uVar24) + 10;
          }
          puVar26 = puVar50;
          if (((uint)(uVar39 >> ((byte)puVar44 & 0x3f)) | -1 << ((byte)uVar20 & 0x1f)) == 0xffffffff
             ) {
            iVar49 = (int)puVar50;
            UVar22 = iVar49 - (int)local_180;
            uVar27 = uVar39 >> (0x40U - (char)hBits & 0x3f) & 0xffffffff;
            if (UVar10 == UVar9) {
              uVar27 = 0;
            }
            plVar32 = ldmState->hashTable + (uVar27 << ((byte)params->bucketSizeLog & 0x3f));
            plVar13 = plVar32 + (1L << ((byte)UVar9 & 0x3f));
            local_c8 = 0;
            local_d0 = 0;
            local_c0 = (ldmEntry_t *)0x0;
            local_138 = 0;
            do {
              if (plVar32->checksum == (U32)(uVar39 >> ((byte)uVar42 & 0x3f))) {
                uVar12 = plVar32->offset;
                uVar27 = (ulong)uVar12;
                if (uVar21 < uVar12) {
                  if (uVar28 < uVar19) {
                    puVar37 = puVar4;
                    pBVar17 = local_180;
                    if (uVar12 < uVar19) {
                      puVar37 = (ulong *)(pBVar33 + uVar43);
                      pBVar17 = pBVar33;
                    }
                    puVar41 = (ulong *)(pBVar17 + uVar27);
                    puVar30 = (ulong *)(((long)puVar37 - (long)puVar41) + (long)puVar50);
                    if (puVar31 <= puVar30) {
                      puVar30 = puVar4;
                    }
                    puVar35 = puVar41;
                    puVar36 = puVar50;
                    if (puVar50 < (ulong *)((long)puVar30 - 7U)) {
                      if (*puVar41 == *puVar50) {
                        lVar34 = 0;
                        do {
                          puVar36 = (ulong *)((long)puVar50 + lVar34 + 8);
                          if ((ulong *)((long)puVar30 - 7U) <= puVar36) {
                            puVar35 = (ulong *)(pBVar17 + lVar34 + uVar27 + 8);
                            goto LAB_0019b548;
                          }
                          lVar18 = lVar34 + uVar27 + 8;
                          lVar34 = lVar34 + 8;
                        } while (*(ulong *)(pBVar17 + lVar18) == *puVar36);
                        uVar47 = *puVar36 ^ *(ulong *)(pBVar17 + lVar18);
                        uVar48 = 0;
                        if (uVar47 != 0) {
                          for (; (uVar47 >> uVar48 & 1) == 0; uVar48 = uVar48 + 1) {
                          }
                        }
                        uVar48 = (uVar48 >> 3 & 0x1fffffff) + lVar34;
                      }
                      else {
                        uVar47 = *puVar50 ^ *puVar41;
                        uVar48 = 0;
                        if (uVar47 != 0) {
                          for (; (uVar47 >> uVar48 & 1) == 0; uVar48 = uVar48 + 1) {
                          }
                        }
                        uVar48 = uVar48 >> 3 & 0x1fffffff;
                      }
                    }
                    else {
LAB_0019b548:
                      if ((puVar36 < (ulong *)((long)puVar30 - 3U)) &&
                         ((int)*puVar35 == (int)*puVar36)) {
                        puVar36 = (ulong *)((long)puVar36 + 4);
                        puVar35 = (ulong *)((long)puVar35 + 4);
                      }
                      if ((puVar36 < (ulong *)((long)puVar30 - 1U)) &&
                         ((short)*puVar35 == (short)*puVar36)) {
                        puVar36 = (ulong *)((long)puVar36 + 2);
                        puVar35 = (ulong *)((long)puVar35 + 2);
                      }
                      if (puVar36 < puVar30) {
                        puVar36 = (ulong *)((long)puVar36 +
                                           (ulong)((byte)*puVar35 == (byte)*puVar36));
                      }
                      uVar48 = (long)puVar36 - (long)puVar50;
                    }
                    if ((ulong *)((long)puVar41 + uVar48) == puVar37) {
                      puVar37 = (ulong *)(uVar48 + (long)puVar50);
                      puVar36 = puVar5;
                      puVar30 = puVar37;
                      if (puVar37 < puVar2) {
                        if (*puVar5 == *puVar37) {
                          lVar34 = 0;
                          do {
                            puVar30 = (ulong *)((long)puVar50 + lVar34 + uVar48 + 8);
                            if (puVar2 <= puVar30) {
                              puVar36 = (ulong *)(local_180 + lVar34 + uVar43 + 8);
                              goto LAB_0019b71f;
                            }
                            lVar18 = lVar34 + uVar43 + 8;
                            lVar34 = lVar34 + 8;
                          } while (*(ulong *)(local_180 + lVar18) == *puVar30);
                          uVar40 = *puVar30 ^ *(ulong *)(local_180 + lVar18);
                          uVar47 = 0;
                          if (uVar40 != 0) {
                            for (; (uVar40 >> uVar47 & 1) == 0; uVar47 = uVar47 + 1) {
                            }
                          }
                          uVar47 = (uVar47 >> 3 & 0x1fffffff) + lVar34;
                        }
                        else {
                          uVar40 = *puVar37 ^ *puVar5;
                          uVar47 = 0;
                          if (uVar40 != 0) {
                            for (; (uVar40 >> uVar47 & 1) == 0; uVar47 = uVar47 + 1) {
                            }
                          }
                          uVar47 = uVar47 >> 3 & 0x1fffffff;
                        }
                      }
                      else {
LAB_0019b71f:
                        if ((puVar30 < (ulong *)((long)puVar4 - 3U)) &&
                           ((int)*puVar36 == (int)*puVar30)) {
                          puVar30 = (ulong *)((long)puVar30 + 4);
                          puVar36 = (ulong *)((long)puVar36 + 4);
                        }
                        if ((puVar30 < (ulong *)((long)puVar4 - 1U)) &&
                           ((short)*puVar36 == (short)*puVar30)) {
                          puVar30 = (ulong *)((long)puVar30 + 2);
                          puVar36 = (ulong *)((long)puVar36 + 2);
                        }
                        if (puVar30 < puVar31) {
                          puVar30 = (ulong *)((long)puVar30 +
                                             (ulong)((byte)*puVar36 == (byte)*puVar30));
                        }
                        uVar47 = (long)puVar30 - (long)puVar37;
                      }
                      uVar48 = uVar48 + uVar47;
                    }
                    uVar28 = uVar55;
                    if (uVar24 <= uVar48) {
                      puVar37 = puVar5;
                      if (uVar12 < uVar19) {
                        puVar37 = puVar25;
                      }
                      if ((local_198 < puVar50) && (puVar37 < puVar41)) {
                        puVar41 = (ulong *)(pBVar17 + uVar27);
                        lVar34 = 0;
                        puVar30 = (ulong *)((long)puVar50 + -1);
                        do {
                          puVar41 = (ulong *)((long)puVar41 + -1);
                          if (((byte)*puVar30 != *(byte *)puVar41) ||
                             (lVar34 = lVar34 + 1, puVar30 <= local_198)) break;
                          puVar30 = (ulong *)((long)puVar30 + -1);
                        } while (puVar37 < puVar41);
                        uVar27 = lVar34 + uVar48;
                      }
                      else {
                        lVar34 = 0;
                        uVar27 = uVar48;
                      }
LAB_0019b807:
                      if (local_138 < uVar27) {
                        local_138 = uVar27;
                        local_d0 = lVar34;
                        local_c8 = uVar48;
                        local_c0 = plVar32;
                      }
                    }
                  }
                  else {
                    puVar37 = (ulong *)(local_180 + uVar27);
                    puVar41 = puVar50;
                    if (puVar50 < puVar2) {
                      if (*puVar37 == *puVar50) {
                        lVar34 = 0;
                        do {
                          puVar41 = (ulong *)((long)puVar50 + lVar34 + 8);
                          if (puVar2 <= puVar41) {
                            puVar37 = (ulong *)(local_180 + lVar34 + uVar27 + 8);
                            goto LAB_0019b645;
                          }
                          lVar18 = lVar34 + uVar27 + 8;
                          lVar34 = lVar34 + 8;
                        } while (*(ulong *)(local_180 + lVar18) == *puVar41);
                        uVar47 = *puVar41 ^ *(ulong *)(local_180 + lVar18);
                        uVar48 = 0;
                        if (uVar47 != 0) {
                          for (; (uVar47 >> uVar48 & 1) == 0; uVar48 = uVar48 + 1) {
                          }
                        }
                        uVar48 = (uVar48 >> 3 & 0x1fffffff) + lVar34;
                      }
                      else {
                        uVar47 = *puVar50 ^ *puVar37;
                        uVar48 = 0;
                        if (uVar47 != 0) {
                          for (; (uVar47 >> uVar48 & 1) == 0; uVar48 = uVar48 + 1) {
                          }
                        }
                        uVar48 = uVar48 >> 3 & 0x1fffffff;
                      }
                    }
                    else {
LAB_0019b645:
                      if ((puVar41 < (ulong *)((long)puVar4 - 3U)) &&
                         ((int)*puVar37 == (int)*puVar41)) {
                        puVar41 = (ulong *)((long)puVar41 + 4);
                        puVar37 = (ulong *)((long)puVar37 + 4);
                      }
                      if ((puVar41 < (ulong *)((long)puVar4 - 1U)) &&
                         ((short)*puVar37 == (short)*puVar41)) {
                        puVar41 = (ulong *)((long)puVar41 + 2);
                        puVar37 = (ulong *)((long)puVar37 + 2);
                      }
                      if (puVar41 < puVar31) {
                        puVar41 = (ulong *)((long)puVar41 +
                                           (ulong)((byte)*puVar37 == (byte)*puVar41));
                      }
                      uVar48 = (long)puVar41 - (long)puVar50;
                    }
                    if (uVar24 <= uVar48) {
                      if ((local_198 < puVar50) && (uVar19 < uVar12)) {
                        lVar34 = 0;
                        puVar37 = (ulong *)((long)puVar50 + -1);
                        puVar41 = (ulong *)(local_180 + (uVar27 - 1));
                        do {
                          if (((byte)*puVar37 != (byte)*puVar41) ||
                             (lVar34 = lVar34 + 1, puVar37 <= local_198)) break;
                          puVar37 = (ulong *)((long)puVar37 + -1);
                          bVar16 = puVar5 < puVar41;
                          puVar41 = (ulong *)((long)puVar41 + -1);
                        } while (bVar16);
                        uVar27 = lVar34 + uVar48;
                      }
                      else {
                        lVar34 = 0;
                        uVar27 = uVar48;
                      }
                      goto LAB_0019b807;
                    }
                  }
                }
              }
              plVar32 = plVar32 + 1;
            } while (plVar32 < plVar13);
            if (local_c0 == (ldmEntry_t *)0x0) {
              ldmParams_00.minMatchLength = uVar21;
              ldmParams_00.enableLdm = in_stack_fffffffffffffe48._0_4_;
              ldmParams_00.hashLog = in_stack_fffffffffffffe48._4_4_;
              ldmParams_00.bucketSizeLog = in_stack_fffffffffffffe48._8_4_;
              ldmParams_00.hashEveryLog = uVar55;
              ldmParams_00.windowLog = uVar19;
              uVar28 = uVar55;
              ZSTD_ldm_makeEntryAndInsertByTag(ldmState,uVar39,hBits,UVar22,ldmParams_00);
              puVar37 = (ulong *)((long)puVar50 + 1);
              uVar55 = uVar28;
            }
            else {
              sVar54 = sequences->size;
              if (sVar54 == sequences->capacity) {
                sVar54 = 0xffffffffffffffba;
                goto LAB_0019ba4d;
              }
              prVar15 = sequences->seq;
              UVar51 = local_c0->offset;
              prVar15[sVar54].litLength = (iVar49 - (int)local_d0) - (int)local_198;
              prVar15[sVar54].matchLength = (int)local_d0 + (int)local_c8;
              prVar15[sVar54].offset = UVar22 - UVar51;
              sequences->size = sVar54 + 1;
              ldmParams.minMatchLength = uVar21;
              ldmParams.enableLdm = in_stack_fffffffffffffe48._0_4_;
              ldmParams.hashLog = in_stack_fffffffffffffe48._4_4_;
              ldmParams.bucketSizeLog = in_stack_fffffffffffffe48._8_4_;
              ldmParams.hashEveryLog = uVar55;
              ldmParams.windowLog = uVar19;
              uVar28 = uVar55;
              ZSTD_ldm_makeEntryAndInsertByTag(ldmState,uVar39,hBits,UVar22,ldmParams);
              puVar37 = (ulong *)(local_c8 + (long)puVar50);
              uVar55 = uVar28;
              local_198 = puVar37;
              if (puVar37 <= puVar45) {
                if (1 < (long)local_c8) {
                  UVar22 = params->minMatchLength;
                  lVar34 = local_c8 - 1;
                  UVar51 = (1 - (int)local_180) + iVar49;
                  do {
                    uVar39 = (uVar39 - ((ulong)(byte)*puVar50 + 10) * ldmState->hashPower) *
                             -0x30e44323485a9b9d +
                             (ulong)*(byte *)((long)puVar50 + (ulong)(UVar22 - 1) + 1) + 10;
                    ldmParams_01.minMatchLength = uVar21;
                    ldmParams_01.enableLdm = in_stack_fffffffffffffe48._0_4_;
                    ldmParams_01.hashLog = in_stack_fffffffffffffe48._4_4_;
                    ldmParams_01.bucketSizeLog = in_stack_fffffffffffffe48._8_4_;
                    ldmParams_01.hashEveryLog = uVar28;
                    ldmParams_01.windowLog = uVar19;
                    ZSTD_ldm_makeEntryAndInsertByTag(ldmState,uVar39,hBits,UVar51,ldmParams_01);
                    puVar50 = (ulong *)((long)puVar50 + 1);
                    UVar51 = UVar51 + 1;
                    lVar34 = lVar34 + -1;
                  } while (lVar34 != 0);
                }
                puVar26 = (ulong *)((long)puVar37 + -1);
                uVar55 = uVar28;
              }
            }
          }
          else {
            puVar37 = (ulong *)((long)puVar50 + 1);
          }
          puVar50 = puVar37;
        } while (puVar37 <= puVar45);
        sVar54 = (long)puVar31 - (long)local_198;
      }
LAB_0019ba4d:
      uVar19 = ZSTD_isError(sVar54);
      if (uVar19 != 0) {
        return sVar54;
      }
      uVar24 = sequences->size;
      if (uVar23 < uVar24) {
        pUVar6 = &sequences->seq[uVar23].litLength;
        *pUVar6 = *pUVar6 + (int)sVar52;
      }
      else {
        sVar54 = sVar53 + sVar52;
      }
      lVar46 = lVar46 + 1;
      local_178 = (void *)((long)local_178 + 0x100000);
      uVar23 = uVar24;
      sVar52 = sVar54;
    } while (lVar46 != lVar29);
  }
  return 0;
}

Assistant:

size_t ZSTD_ldm_generateSequences(
        ldmState_t* ldmState, rawSeqStore_t* sequences,
        ldmParams_t const* params, void const* src, size_t srcSize)
{
    U32 const maxDist = 1U << params->windowLog;
    BYTE const* const istart = (BYTE const*)src;
    BYTE const* const iend = istart + srcSize;
    size_t const kMaxChunkSize = 1 << 20;
    size_t const nbChunks = (srcSize / kMaxChunkSize) + ((srcSize % kMaxChunkSize) != 0);
    size_t chunk;
    size_t leftoverSize = 0;

    assert(ZSTD_CHUNKSIZE_MAX >= kMaxChunkSize);
    /* Check that ZSTD_window_update() has been called for this chunk prior
     * to passing it to this function.
     */
    assert(ldmState->window.nextSrc >= (BYTE const*)src + srcSize);
    /* The input could be very large (in zstdmt), so it must be broken up into
     * chunks to enforce the maximmum distance and handle overflow correction.
     */
    assert(sequences->pos <= sequences->size);
    assert(sequences->size <= sequences->capacity);
    for (chunk = 0; chunk < nbChunks && sequences->size < sequences->capacity; ++chunk) {
        BYTE const* const chunkStart = istart + chunk * kMaxChunkSize;
        size_t const remaining = (size_t)(iend - chunkStart);
        BYTE const *const chunkEnd =
            (remaining < kMaxChunkSize) ? iend : chunkStart + kMaxChunkSize;
        size_t const chunkSize = chunkEnd - chunkStart;
        size_t newLeftoverSize;
        size_t const prevSize = sequences->size;

        assert(chunkStart < iend);
        /* 1. Perform overflow correction if necessary. */
        if (ZSTD_window_needOverflowCorrection(ldmState->window, chunkEnd)) {
            U32 const ldmHSize = 1U << params->hashLog;
            U32 const correction = ZSTD_window_correctOverflow(
                &ldmState->window, /* cycleLog */ 0, maxDist, src);
            ZSTD_ldm_reduceTable(ldmState->hashTable, ldmHSize, correction);
        }
        /* 2. We enforce the maximum offset allowed.
         *
         * kMaxChunkSize should be small enough that we don't lose too much of
         * the window through early invalidation.
         * TODO: * Test the chunk size.
         *       * Try invalidation after the sequence generation and test the
         *         the offset against maxDist directly.
         */
        ZSTD_window_enforceMaxDist(&ldmState->window, chunkEnd, maxDist, NULL);
        /* 3. Generate the sequences for the chunk, and get newLeftoverSize. */
        newLeftoverSize = ZSTD_ldm_generateSequences_internal(
            ldmState, sequences, params, chunkStart, chunkSize);
        if (ZSTD_isError(newLeftoverSize))
            return newLeftoverSize;
        /* 4. We add the leftover literals from previous iterations to the first
         *    newly generated sequence, or add the `newLeftoverSize` if none are
         *    generated.
         */
        /* Prepend the leftover literals from the last call */
        if (prevSize < sequences->size) {
            sequences->seq[prevSize].litLength += (U32)leftoverSize;
            leftoverSize = newLeftoverSize;
        } else {
            assert(newLeftoverSize == chunkSize);
            leftoverSize += chunkSize;
        }
    }
    return 0;
}